

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPParser.cpp
# Opt level: O3

SNMP_ERROR_RESPONSE
handlePacket(uint8_t *buffer,int packetLength,int *responseLength,int max_packet_size,
            deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,string *_community,
            string *_readOnlyCommunity,informCB informCallback,void *ctx)

{
  VarBind *pVVar1;
  pointer __s1;
  size_type sVar2;
  VarBind *pVVar3;
  _Elt_pointer pVVar4;
  SNMP_PACKET_PARSE_ERROR SVar5;
  int iVar6;
  _Map_pointer ppVVar7;
  VarBind *item;
  VarBind *response_00;
  SNMP_ERROR_STATUS error;
  SNMP_ERROR_RESPONSE SVar8;
  bool bVar9;
  bool bVar10;
  deque<VarBind,_std::allocator<VarBind>_> outResponseList;
  SNMPPacket request;
  SNMPResponse response;
  _Deque_base<VarBind,_std::allocator<VarBind>_> local_238;
  SNMPPacket local_1e0;
  SNMPPacket local_108;
  
  SNMPPacket::SNMPPacket(&local_1e0);
  SVar5 = SNMPPacket::parseFrom(&local_1e0,buffer,(long)packetLength);
  if (SVar5 < 1) {
    SVar8 = SNMP_REQUEST_INVALID;
    goto LAB_0016aaa1;
  }
  if (local_1e0.packetPDUType == GetResponsePDU) {
    SVar8 = SNMP_INFORM_RESPONSE_OCCURRED;
    if (informCallback != (informCB)0x0) {
      (*informCallback)(ctx,local_1e0.requestID,local_1e0.errorStatus.errorStatus == NO_ERROR);
    }
    goto LAB_0016aaa1;
  }
  __s1 = (_community->_M_dataplus)._M_p;
  sVar2 = _community->_M_string_length;
  if (_readOnlyCommunity->_M_string_length == local_1e0.communityString._M_string_length &&
      _readOnlyCommunity->_M_string_length != 0) {
    iVar6 = bcmp((_readOnlyCommunity->_M_dataplus)._M_p,local_1e0.communityString._M_dataplus._M_p,
                 local_1e0.communityString._M_string_length);
    bVar9 = iVar6 != 0;
    if (sVar2 == local_1e0.communityString._M_string_length) goto LAB_0016a891;
    SVar8 = SNMP_REQUEST_INVALID_COMMUNITY;
    if (iVar6 != 0) goto LAB_0016aaa1;
    bVar10 = false;
  }
  else {
    SVar8 = SNMP_REQUEST_INVALID_COMMUNITY;
    bVar9 = true;
    if (sVar2 != local_1e0.communityString._M_string_length) goto LAB_0016aaa1;
LAB_0016a891:
    if (local_1e0.communityString._M_string_length == 0) {
      bVar10 = true;
    }
    else {
      iVar6 = bcmp(__s1,local_1e0.communityString._M_dataplus._M_p,
                   local_1e0.communityString._M_string_length);
      bVar10 = iVar6 == 0;
      if ((!bVar10) && (SVar8 = SNMP_REQUEST_INVALID_COMMUNITY, !(bool)(bVar9 ^ 1)))
      goto LAB_0016aaa1;
    }
  }
  SNMPResponse::SNMPResponse((SNMPResponse *)&local_108,&local_1e0);
  local_238._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_finish._M_cur = (VarBind *)0x0;
  local_238._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_last = (VarBind *)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_cur = (VarBind *)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_map_size = 0;
  Catch::clara::std::_Deque_base<VarBind,_std::allocator<VarBind>_>::_M_initialize_map(&local_238,0)
  ;
  error = GEN_ERR;
  if (local_1e0.packetPDUType - GetRequestPDU < 2) {
    bVar9 = handleGetRequestPDU(callbacks,&local_1e0.varbindList,
                                (deque<VarBind,_std::allocator<VarBind>_> *)&local_238,
                                local_1e0.snmpVersion,local_1e0.packetPDUType == GetNextRequestPDU);
    if (!bVar9) goto LAB_0016aa3a;
    SVar8 = (uint)(local_1e0.packetPDUType == GetRequestPDU) ^ SNMP_GETNEXT_OCCURRED;
    response_00 = local_238._M_impl.super__Deque_impl_data._M_start._M_cur;
    pVVar1 = local_238._M_impl.super__Deque_impl_data._M_start._M_last;
    ppVVar7 = local_238._M_impl.super__Deque_impl_data._M_start._M_node;
    pVVar3 = local_238._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pVVar4 = local_238._M_impl.super__Deque_impl_data._M_finish._M_cur;
joined_r0x0016a9df:
    while (local_238._M_impl.super__Deque_impl_data._M_finish._M_cur = pVVar4,
          pVVar4 = local_238._M_impl.super__Deque_impl_data._M_finish._M_cur,
          bVar9 = response_00 != local_238._M_impl.super__Deque_impl_data._M_finish._M_cur,
          local_238._M_impl.super__Deque_impl_data._M_finish._M_cur = pVVar3, bVar9) {
      if (response_00->errorStatus == NO_ERROR) {
        SNMPResponse::addResponse((SNMPResponse *)&local_108,response_00);
      }
      else {
        SNMPResponse::addErrorResponse((SNMPResponse *)&local_108,response_00);
      }
      response_00 = response_00 + 1;
      pVVar3 = local_238._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (response_00 == pVVar1) {
        response_00 = ppVVar7[1];
        ppVVar7 = ppVVar7 + 1;
        pVVar1 = response_00 + 10;
      }
    }
  }
  else {
    if (local_1e0.packetPDUType == SetRequestPDU) {
      error = NO_ACCESS;
      if (bVar10) {
        bVar9 = handleSetRequestPDU(callbacks,&local_1e0.varbindList,
                                    (deque<VarBind,_std::allocator<VarBind>_> *)&local_238,
                                    local_1e0.snmpVersion);
        SVar8 = SNMP_SET_OCCURRED;
        goto LAB_0016a9c8;
      }
    }
    else if ((local_1e0.packetPDUType == GetBulkRequestPDU) &&
            (local_1e0.snmpVersion == SNMP_VERSION_2C)) {
      bVar9 = handleGetBulkRequestPDU
                        (callbacks,&local_1e0.varbindList,
                         (deque<VarBind,_std::allocator<VarBind>_> *)&local_238,
                         local_1e0.errorStatus.errorStatus,local_1e0.errorIndex.errorIndex);
      SVar8 = SNMP_GETBULK_OCCURRED;
LAB_0016a9c8:
      error = GEN_ERR;
      response_00 = local_238._M_impl.super__Deque_impl_data._M_start._M_cur;
      pVVar1 = local_238._M_impl.super__Deque_impl_data._M_start._M_last;
      ppVVar7 = local_238._M_impl.super__Deque_impl_data._M_start._M_node;
      pVVar3 = local_238._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pVVar4 = local_238._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (bVar9 != false) goto joined_r0x0016a9df;
    }
LAB_0016aa3a:
    SVar8 = SNMP_ERROR_PACKET_SENT;
    SNMPResponse::setGlobalError((SNMPResponse *)&local_108,error,0,1);
  }
  memset(buffer,0,(long)max_packet_size);
  iVar6 = SNMPPacket::serialiseInto(&local_108,buffer,(long)max_packet_size);
  *responseLength = iVar6;
  if (iVar6 < 1) {
    SVar8 = SNMP_FAILED_SERIALISATION;
  }
  std::deque<VarBind,_std::allocator<VarBind>_>::~deque
            ((deque<VarBind,_std::allocator<VarBind>_> *)&local_238);
  SNMPPacket::~SNMPPacket(&local_108);
LAB_0016aaa1:
  SNMPPacket::~SNMPPacket(&local_1e0);
  return SVar8;
}

Assistant:

SNMP_ERROR_RESPONSE handlePacket(uint8_t* buffer, int packetLength, int* responseLength, int max_packet_size, std::deque<ValueCallback*> &callbacks, const std::string& _community, const std::string& _readOnlyCommunity, informCB informCallback, void* ctx){
    SNMPPacket request;

    SNMP_PACKET_PARSE_ERROR parseResult = request.parseFrom(buffer, packetLength);
    if(parseResult <= 0){
        SNMP_LOGW("Received Error code: %d when attempting to parse\n", parseResult);
        return SNMP_REQUEST_INVALID;
    }

    SNMP_LOGD("Valid SNMP Packet!");

    if(request.packetPDUType == GetResponsePDU){
        SNMP_LOGD("Received GetResponse! probably as a result of a recent InformTrap: %lu", request.requestID);
        if(informCallback){
            informCallback(ctx, request.requestID, !request.errorStatus.errorStatus);
        } else {
            SNMP_LOGW("Not sure what to do with Inform\n");
        }
        return SNMP_INFORM_RESPONSE_OCCURRED;
    }

    SNMP_PERMISSION requestPermission = getPermissionOfRequest(request, _community, _readOnlyCommunity);
    if(requestPermission == SNMP_PERM_NONE){
        SNMP_LOGW("Invalid communitystring provided: %s, no response to give\n", request.communityString.c_str());
        return SNMP_REQUEST_INVALID_COMMUNITY;
    }
    
    // this will take the required stuff from request - like requestID and community string etc
    SNMPResponse response = SNMPResponse(request);

    std::deque<VarBind> outResponseList;

    bool pass = false;
    SNMP_ERROR_RESPONSE handleStatus = SNMP_NO_ERROR;
    SNMP_ERROR_STATUS globalError = GEN_ERR;

    switch(request.packetPDUType){
        case GetRequestPDU:
        case GetNextRequestPDU:
            pass = handleGetRequestPDU(callbacks, request.varbindList, outResponseList, request.snmpVersion, request.packetPDUType == GetNextRequestPDU);
            handleStatus = request.packetPDUType == GetRequestPDU ? SNMP_GET_OCCURRED : SNMP_GETNEXT_OCCURRED;
        break;
        case GetBulkRequestPDU:
            if(request.snmpVersion != SNMP_VERSION_2C){
                SNMP_LOGD("Received GetBulkRequest in SNMP_VERSION_1");
                pass = false;
                globalError = GEN_ERR;
            } else {
                pass = handleGetBulkRequestPDU(callbacks, request.varbindList, outResponseList, request.errorStatus.nonRepeaters, request.errorIndex.maxRepititions);
                handleStatus = SNMP_GETBULK_OCCURRED;
            }
        break;
        case SetRequestPDU:
            if(requestPermission != SNMP_PERM_READ_WRITE){
                SNMP_LOGD("Attempting to perform a SET without required permissions");
                pass = false;
                globalError = NO_ACCESS;
            } else {
                pass = handleSetRequestPDU(callbacks, request.varbindList, outResponseList, request.snmpVersion);
                handleStatus = SNMP_SET_OCCURRED;
            }
        break;
        default:
            SNMP_LOGD("Not sure what to do with SNMP PDU of type: %d\n", request.packetPDUType);
            handleStatus = SNMP_UNKNOWN_PDU_OCCURRED;
            pass = false;
        break;
    }

    if(pass){
        for(const auto& item : outResponseList){
            if(item.errorStatus != NO_ERROR){
                response.addErrorResponse(item);
            } else {
                response.addResponse(item);
            }
        }
    } else {
        // Something went wrong, generic error response
        SNMP_LOGD("Handled error when building request, error: %d, sending error PDU", globalError);
        response.setGlobalError(globalError, 0, true);
        handleStatus = SNMP_ERROR_PACKET_SENT;
    }

    memset(buffer, 0, max_packet_size);

    *responseLength = response.serialiseInto(buffer, max_packet_size);
    if(*responseLength <= 0){
        SNMP_LOGD("Failed to build response packet");
        return SNMP_FAILED_SERIALISATION;
    }

    return handleStatus;
}